

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O3

TrieNode<unsigned_char> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,vector_brodnik<unsigned_char_*> *bucket,size_t depth)

{
  byte bVar1;
  uchar **ppuVar2;
  TrieNode<unsigned_char> *__s;
  uchar *puVar3;
  vector_brodnik<unsigned_char_*> *pvVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  uint j_1;
  uint j;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  array<unsigned_char,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  byte abStack_270 [64];
  undefined8 auStack_230 [64];
  
  __s = (TrieNode<unsigned_char> *)operator_new(0x820);
  uVar10 = 0;
  memset(__s,0,0x820);
  uVar7 = ((2L << (bucket->_superblock & 0x3f)) -
          ((ulong)bucket->_left_in_superblock * bucket->_block_size + bucket->_left_in_block)) +
          0xffffffc0;
  uVar6 = (uint)uVar7;
  if (0x3f < uVar6) {
    uVar10 = 0;
    do {
      lVar8 = 0;
      do {
        puVar3 = vector_brodnik<unsigned_char_*>::operator[](bucket,lVar8 + uVar10);
        auStack_230[lVar8] = puVar3;
        if (puVar3 == (uchar *)0x0) goto LAB_001a8184;
        abStack_270[lVar8] = puVar3[depth];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      lVar8 = 0;
      do {
        bVar1 = abStack_270[lVar8];
        pvVar4 = (vector_brodnik<unsigned_char_*> *)(__s->buckets)._M_elems[bVar1];
        if (pvVar4 == (vector_brodnik<unsigned_char_*> *)0x0) {
          pvVar4 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
          (pvVar4->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar4->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar4->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vector_brodnik<unsigned_char_*>::clear(pvVar4);
          (__s->buckets)._M_elems[bVar1] = pvVar4;
        }
        sVar9 = pvVar4->_left_in_block;
        if (sVar9 == 0) {
          vector_brodnik<unsigned_char_*>::grow(pvVar4);
          sVar9 = pvVar4->_left_in_block;
        }
        puVar3 = (uchar *)auStack_230[lVar8];
        ppuVar2 = pvVar4->_insertpos;
        pvVar4->_insertpos = ppuVar2 + 1;
        *ppuVar2 = puVar3;
        pvVar4->_left_in_block = sVar9 - 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      uVar10 = uVar10 + 0x40;
    } while (uVar10 < (uVar6 & 0xffffffc0));
  }
  if ((uint)uVar10 < uVar6) {
    sVar9 = uVar10 & 0xffffffff;
    do {
      puVar3 = vector_brodnik<unsigned_char_*>::operator[](bucket,sVar9);
      if (puVar3 == (uchar *)0x0) {
LAB_001a8184:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar1 = puVar3[depth];
      pvVar4 = (vector_brodnik<unsigned_char_*> *)(__s->buckets)._M_elems[bVar1];
      if (pvVar4 == (vector_brodnik<unsigned_char_*> *)0x0) {
        pvVar4 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
        (pvVar4->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar4->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar4->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vector_brodnik<unsigned_char_*>::clear(pvVar4);
        (__s->buckets)._M_elems[bVar1] = pvVar4;
      }
      sVar5 = pvVar4->_left_in_block;
      if (sVar5 == 0) {
        vector_brodnik<unsigned_char_*>::grow(pvVar4);
        sVar5 = pvVar4->_left_in_block;
      }
      ppuVar2 = pvVar4->_insertpos;
      pvVar4->_insertpos = ppuVar2 + 1;
      *ppuVar2 = puVar3;
      pvVar4->_left_in_block = sVar5 - 1;
      sVar9 = sVar9 + 1;
    } while (sVar9 < (uVar7 & 0xffffffff));
  }
  return __s;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}